

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O1

void __thiscall argo::json::move_json(json *this,json *other)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<argo::json,_std::default_delete<argo::json>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>_>
  *pmVar1;
  type tVar2;
  pointer puVar3;
  _Iter in_R8;
  insert_iterator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<argo::json,_std::default_delete<argo::json>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>_>_>
  __result;
  
  if (this != other) {
    reset(this);
    tVar2 = other->m_type;
    this->m_type = tVar2;
    switch(tVar2) {
    case object_e:
      pmVar1 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<argo::json,_std::default_delete<argo::json>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>_>
                *)((long)&this->m_value + 8);
      *(undefined4 *)((long)&this->m_value + 8) = 0;
      (this->m_value).u_array.
      super__Vector_base<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>,_std::allocator<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      *(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<argo::json,_std::default_delete<argo::json>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>_>
        **)((long)&this->m_value + 0x18) = pmVar1;
      *(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<argo::json,_std::default_delete<argo::json>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>_>
        **)((long)&this->m_value + 0x20) = pmVar1;
      *(undefined8 *)((long)&this->m_value + 0x28) = 0;
      __result.iter._M_node = in_R8._M_node;
      __result.container = pmVar1;
      std::__copy_move<true,false,std::bidirectional_iterator_tag>::
      __copy_m<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,std::unique_ptr<argo::json,std::default_delete<argo::json>>>>,std::insert_iterator<std::map<std::__cxx11::string,std::unique_ptr<argo::json,std::default_delete<argo::json>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<argo::json,std::default_delete<argo::json>>>>>>>
                (*(__copy_move<true,false,std::bidirectional_iterator_tag> **)
                  ((long)&other->m_value + 0x18),(_Base_ptr)((long)&other->m_value + 8),
                 (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>
                  )&this->m_value,__result);
      break;
    case array_e:
      move_construct_array(this,&(other->m_value).u_array);
      break;
    case boolean_e:
      (this->m_value).u_boolean = (other->m_value).u_boolean;
      break;
    case number_int_e:
      (this->m_value).u_number_int = (other->m_value).u_number_int;
      break;
    case number_double_e:
      (this->m_value).u_array.
      super__Vector_base<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>,_std::allocator<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (other->m_value).u_array.
           super__Vector_base<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>,_std::allocator<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      break;
    case string_e:
      (this->m_value).u_array.
      super__Vector_base<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>,_std::allocator<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)((long)&this->m_value + 0x10);
      puVar3 = (other->m_value).u_array.
               super__Vector_base<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>,_std::allocator<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&this->m_value,puVar3,
                 (long)&(puVar3->_M_t).
                        super___uniq_ptr_impl<argo::json,_std::default_delete<argo::json>_>._M_t +
                 (long)&(((other->m_value).u_array.
                          super__Vector_base<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>,_std::allocator<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish)->_M_t).
                        super___uniq_ptr_impl<argo::json,_std::default_delete<argo::json>_>._M_t.
                        super__Tuple_impl<0UL,_argo::json_*,_std::default_delete<argo::json>_>.
                        super__Head_base<0UL,_argo::json_*,_false>._M_head_impl);
    }
    std::__cxx11::string::operator=((string *)&this->m_raw_value,(string *)&other->m_raw_value);
    other->m_type = null_e;
  }
  return;
}

Assistant:

void json::move_json(json &other)
{
    if (this == &other) return;

    reset();
    m_type = other.m_type;
    if (m_type == object_e)
    {
        move_construct_object(std::move(other.m_value.u_object));
    }
    else if (m_type == array_e)
    {
        move_construct_array(std::move(other.m_value.u_array));
    }
    else if (m_type == string_e)
    {
        construct_string(other.m_value.u_string);
    }
    else if (m_type == boolean_e)
    {
        m_value.u_boolean = other.m_value.u_boolean;
    }
    else if (m_type == number_int_e)
    {
        m_value.u_number_int = other.m_value.u_number_int;
    }
    else if (m_type == number_double_e)
    {
        m_value.u_number_double = other.m_value.u_number_double;
    }

    m_raw_value = std::move(other.m_raw_value);

    other.m_type = null_e;
}